

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O2

int __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::solveUpdateLeft(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *eps,
                 number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *vec,int *nonz,int n)

{
  int iVar1;
  int iVar2;
  fpclass_type fVar3;
  int32_t iVar4;
  cpp_dec_float<200U,_int,_void> *pcVar5;
  cpp_dec_float<200U,_int,_void> *pcVar6;
  type_conflict5 tVar7;
  bool bVar8;
  long lVar9;
  long lVar10;
  cpp_dec_float<200U,_int,_void> *pcVar11;
  uint *puVar12;
  cpp_dec_float<200U,_int,_void> *pcVar13;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar14;
  uint *puVar15;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar16;
  int iVar17;
  int *piVar18;
  byte bVar19;
  int local_308;
  int local_304;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_300;
  int *local_2f8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2f0;
  int *local_2e8;
  int *local_2e0;
  int *local_2d8;
  pointer local_2d0;
  long local_2c8;
  long local_2c0;
  cpp_dec_float<200U,_int,_void> local_2b8;
  cpp_dec_float<200U,_int,_void> local_238;
  cpp_dec_float<200U,_int,_void> local_1b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_130;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b0;
  
  bVar19 = 0;
  local_2d0 = (this->l).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_2d8 = (this->l).idx;
  local_2e0 = (this->l).row;
  local_2e8 = (this->l).start;
  local_2c8 = (long)(this->l).firstUpdate;
  local_2c0 = (long)(this->l).firstUnused;
  local_308 = n;
  local_2f8 = nonz;
  local_2f0 = eps;
  while( true ) {
    lVar9 = 0x1c;
    if (local_2c0 <= local_2c8) break;
    lVar10 = local_2c0 + -1;
    iVar1 = local_2e8[lVar10];
    iVar2 = local_2e0[lVar10];
    local_300 = vec + iVar2;
    pnVar14 = local_300;
    pcVar11 = &local_2b8;
    for (; lVar9 != 0; lVar9 = lVar9 + -1) {
      (pcVar11->data)._M_elems[0] = (pnVar14->m_backend).data._M_elems[0];
      pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar14 + ((ulong)bVar19 * -2 + 1) * 4);
      pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + ((ulong)bVar19 * -2 + 1) * 4);
    }
    puVar12 = vec[iVar2].m_backend.data._M_elems + 1;
    local_2b8.exp = puVar12[0x1b];
    local_2b8.neg = *(bool *)(puVar12 + 0x1c);
    local_2b8.fpclass = puVar12[0x1d];
    local_2b8.prec_elem = puVar12[0x1e];
    puVar15 = local_1b0.data._M_elems + 1;
    for (lVar9 = 0x1b; lVar9 != 0; lVar9 = lVar9 + -1) {
      *puVar15 = *puVar12;
      puVar12 = puVar12 + (ulong)bVar19 * -2 + 1;
      puVar15 = puVar15 + (ulong)bVar19 * -2 + 1;
    }
    local_1b0.data._M_elems[0] = local_2b8.data._M_elems[0];
    local_1b0.neg =
         (bool)((local_2b8.data._M_elems[0] != 0 || local_2b8.fpclass != cpp_dec_float_finite) ^
               local_2b8.neg);
    piVar18 = local_2d8 + iVar1;
    iVar17 = local_2e8[local_2c0];
    pcVar11 = &local_2d0[iVar1].m_backend;
    local_2c0 = lVar10;
    local_1b0.exp = local_2b8.exp;
    local_1b0.fpclass = local_2b8.fpclass;
    local_1b0.prec_elem = local_2b8.prec_elem;
    for (; iVar2 < iVar17; iVar17 = iVar17 + -1) {
      iVar1 = *piVar18;
      piVar18 = piVar18 + 1;
      local_238.fpclass = cpp_dec_float_finite;
      local_238.prec_elem = 0x1c;
      local_238.data._M_elems[0] = 0;
      local_238.data._M_elems[1] = 0;
      local_238.data._M_elems[2] = 0;
      local_238.data._M_elems[3] = 0;
      local_238.data._M_elems[4] = 0;
      local_238.data._M_elems[5] = 0;
      local_238.data._M_elems[6] = 0;
      local_238.data._M_elems[7] = 0;
      local_238.data._M_elems[8] = 0;
      local_238.data._M_elems[9] = 0;
      local_238.data._M_elems[10] = 0;
      local_238.data._M_elems[0xb] = 0;
      local_238.data._M_elems[0xc] = 0;
      local_238.data._M_elems[0xd] = 0;
      local_238.data._M_elems[0xe] = 0;
      local_238.data._M_elems[0xf] = 0;
      local_238.data._M_elems[0x10] = 0;
      local_238.data._M_elems[0x11] = 0;
      local_238.data._M_elems[0x12] = 0;
      local_238.data._M_elems[0x13] = 0;
      local_238.data._M_elems[0x14] = 0;
      local_238.data._M_elems[0x15] = 0;
      local_238.data._M_elems[0x16] = 0;
      local_238.data._M_elems[0x17] = 0;
      local_238.data._M_elems[0x18] = 0;
      local_238.data._M_elems[0x19] = 0;
      local_238.data._M_elems._104_5_ = 0;
      local_238.data._M_elems[0x1b]._1_3_ = 0;
      local_238.exp = 0;
      local_238.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&local_238,&vec[iVar1].m_backend,pcVar11);
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                (&local_1b0,&local_238);
      pcVar11 = pcVar11 + 1;
    }
    local_238.data._M_elems._0_8_ = local_238.data._M_elems._0_8_ & 0xffffffff00000000;
    pcVar11 = &local_2b8;
    tVar7 = boost::multiprecision::operator==
                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)pcVar11,(int *)&local_238);
    local_2b8.data._M_elems[0] = local_1b0.data._M_elems[0];
    puVar12 = local_1b0.data._M_elems + 1;
    puVar15 = local_2b8.data._M_elems + 1;
    for (lVar9 = 0x1b; lVar9 != 0; lVar9 = lVar9 + -1) {
      *puVar15 = *puVar12;
      puVar12 = puVar12 + (ulong)bVar19 * -2 + 1;
      puVar15 = puVar15 + (ulong)bVar19 * -2 + 1;
    }
    local_2b8.neg =
         (bool)((local_2b8.data._M_elems[0] != 0 || local_1b0.fpclass != cpp_dec_float_finite) ^
               local_1b0.neg);
    local_2b8.exp = local_1b0.exp;
    local_2b8.fpclass = local_1b0.fpclass;
    local_2b8.prec_elem = local_1b0.prec_elem;
    if (tVar7) {
      lVar9 = 0x1c;
      pcVar13 = pcVar11;
      pnVar14 = &local_130;
      for (lVar10 = lVar9; lVar10 != 0; lVar10 = lVar10 + -1) {
        (pnVar14->m_backend).data._M_elems[0] =
             (((cpp_dec_float<200U,_int,_void> *)&pcVar13->data)->data)._M_elems[0];
        pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + ((ulong)bVar19 * -2 + 1) * 4);
        pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar14 + ((ulong)bVar19 * -2 + 1) * 4);
      }
      local_130.m_backend.exp = local_1b0.exp;
      local_130.m_backend.fpclass = local_1b0.fpclass;
      local_130.m_backend.prec_elem = local_1b0.prec_elem;
      pnVar14 = local_2f0;
      pnVar16 = &local_b0;
      for (lVar10 = lVar9; lVar10 != 0; lVar10 = lVar10 + -1) {
        (pnVar16->m_backend).data._M_elems[0] = (pnVar14->m_backend).data._M_elems[0];
        pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar14 + ((ulong)bVar19 * -2 + 1) * 4);
        pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar16 + ((ulong)bVar19 * -2 + 1) * 4);
      }
      local_b0.m_backend.exp = (local_2f0->m_backend).exp;
      local_b0.m_backend.neg = (local_2f0->m_backend).neg;
      local_b0.m_backend.fpclass = (local_2f0->m_backend).fpclass;
      local_b0.m_backend.prec_elem = (local_2f0->m_backend).prec_elem;
      local_130.m_backend.neg = local_2b8.neg;
      bVar8 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_130,&local_b0);
      if (bVar8) {
        lVar10 = (long)local_308;
        local_308 = local_308 + 1;
        local_2f8[lVar10] = iVar2;
        pnVar14 = local_300;
        for (; lVar9 != 0; lVar9 = lVar9 + -1) {
          (pnVar14->m_backend).data._M_elems[0] =
               (((cpp_dec_float<200U,_int,_void> *)&pcVar11->data)->data)._M_elems[0];
          pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + ((ulong)bVar19 * -2 + 1) * 4)
          ;
          pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar14 + ((ulong)bVar19 * -2 + 1) * 4);
        }
        (local_300->m_backend).exp = local_2b8.exp;
        (local_300->m_backend).neg = local_2b8.neg;
        (local_300->m_backend).fpclass = local_2b8.fpclass;
        (local_300->m_backend).prec_elem = local_2b8.prec_elem;
      }
    }
    else {
      local_304 = 0;
      tVar7 = boost::multiprecision::operator!=
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)pcVar11,&local_304);
      lVar9 = 0x1c;
      lVar10 = lVar9;
      pcVar13 = &local_238;
      if (tVar7) {
        for (; lVar10 != 0; lVar10 = lVar10 + -1) {
          (pcVar13->data)._M_elems[0] =
               (((cpp_dec_float<200U,_int,_void> *)&pcVar11->data)->data)._M_elems[0];
          pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + ((ulong)bVar19 * -2 + 1) * 4)
          ;
          pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar19 * -8 + 4);
        }
        pcVar11 = (cpp_dec_float<200U,_int,_void> *)&local_2b8.data;
        pcVar13 = (cpp_dec_float<200U,_int,_void> *)&local_2b8.data;
        pcVar5 = (cpp_dec_float<200U,_int,_void> *)&local_2b8.data;
        pcVar6 = (cpp_dec_float<200U,_int,_void> *)&local_2b8.data;
      }
      else {
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                  (&local_238,1e-100,(type *)0x0);
        pcVar11 = &local_238;
        pcVar13 = &local_238;
        pcVar5 = &local_238;
        pcVar6 = &local_238;
      }
      iVar1 = pcVar11->exp;
      bVar8 = pcVar13->neg;
      fVar3 = pcVar5->fpclass;
      iVar4 = pcVar6->prec_elem;
      pcVar11 = &local_238;
      pnVar14 = local_300;
      for (; lVar9 != 0; lVar9 = lVar9 + -1) {
        (pnVar14->m_backend).data._M_elems[0] = (pcVar11->data)._M_elems[0];
        pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar19 * -8 + 4);
        pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar14 + ((ulong)bVar19 * -2 + 1) * 4);
      }
      (local_300->m_backend).exp = iVar1;
      (local_300->m_backend).neg = bVar8;
      (local_300->m_backend).fpclass = fVar3;
      (local_300->m_backend).prec_elem = iVar4;
    }
  }
  return local_308;
}

Assistant:

int CLUFactor<R>::solveUpdateLeft(R eps, R* vec, int* nonz, int n)
{
   int i, j, k, end;
   R y;
   R* lval, *val;
   int* lrow, *lidx, *idx;
   int* lbeg;

   assert(!l.updateType);               /* no Forest-Tomlin Updates! */

   lval = l.val.data();
   lidx = l.idx;
   lrow = l.row;
   lbeg = l.start;

   end = l.firstUpdate;

   for(i = l.firstUnused - 1; i >= end; --i)
   {
      k = lbeg[i];
      assert(k >= 0 && k < l.size);
      val = &lval[k];
      idx = &lidx[k];

      k = lrow[i];

      y = vec[k];
      StableSum<R> tmp(-y);

      for(j = lbeg[i + 1]; j > k; --j)
      {
         assert(*idx >= 0 && *idx < thedim);
         tmp += vec[*idx++] * (*val++);
      }

      if(y == 0)
      {
         y = -R(tmp);

         if(isNotZero(y, eps))
         {
            nonz[n++] = k;
            vec[k] = y;
         }
      }
      else
      {
         y = -R(tmp);
         vec[k] = (y != 0) ? y : SOPLEX_FACTOR_MARKER;
      }
   }

   return n;
}